

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolvmin.cpp
# Opt level: O3

bool __thiscall chrono::ChOptimizerLocal::DoOptimize(ChOptimizerLocal *this)

{
  undefined1 auVar1 [16];
  uint n;
  double *pdVar2;
  undefined1 auVar3 [16];
  double dVar4;
  undefined1 auVar5 [16];
  int breakCicle;
  int local_7c;
  double local_78;
  double local_70;
  double dStack_68;
  double local_60;
  undefined8 local_58;
  double local_50;
  double dStack_48;
  double local_40;
  double local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  double local_20;
  
  n = (*(this->super_ChOptimizer)._vptr_ChOptimizer[7])();
  if ((int)n < 1) {
    (this->super_ChOptimizer).error_code = 1;
  }
  else {
    auVar5._8_8_ = 0;
    auVar5._0_8_ = this->initial_step;
    (this->super_ChOptimizer).error_code = 0;
    auVar3._8_8_ = 0x8000000000000000;
    auVar3._0_8_ = 0x8000000000000000;
    auVar3 = vorpd_avx512vl(auVar5,auVar3);
    local_78 = (double)vmovlpd_avx(auVar3);
    local_70 = this->arg_tol;
    dStack_68 = this->fun_tol;
    local_60 = (double)this->maxiters;
    local_58 = 0;
    local_50 = this->gamma;
    dStack_48 = this->dilation;
    local_40 = this->gradstep;
    local_28 = 0;
    local_38 = 0.0;
    uStack_30 = 0;
    local_20 = (double)this->maxevaluations;
    breakCicle = 0;
    pdVar2 = (this->super_ChOptimizer).xv;
    if ((this->super_ChOptimizer).C_vars == 0) {
      if (pdVar2 != (double *)0x0) {
        operator_delete__(pdVar2);
      }
      pdVar2 = (double *)operator_new__((ulong)n * 8 + 0x18);
      (this->super_ChOptimizer).xv = pdVar2;
    }
    dVar4 = solvopt(n,pdVar2,CalcFO,null_entry_solv_opt,&local_78,this,showVarFun,1,&breakCicle,
                    &local_7c);
    (this->super_ChOptimizer).opt_fx = dVar4;
    auVar1._8_8_ = local_28;
    auVar1._0_8_ = uStack_30;
    auVar3 = vcvttpd2qq_avx512vl(auVar1);
    (this->super_ChOptimizer).fx_evaluations = auVar3._0_8_;
    (this->super_ChOptimizer).grad_evaluations = auVar3._8_8_;
    this->iters_done = (long)local_38;
    if ((this->super_ChOptimizer).C_vars == 0) {
      pdVar2 = (this->super_ChOptimizer).xv;
      if (pdVar2 != (double *)0x0) {
        operator_delete__(pdVar2);
      }
      (this->super_ChOptimizer).xv = (double *)0x0;
    }
  }
  return 0 < (int)n;
}

Assistant:

bool ChOptimizerLocal::DoOptimize() {
    double solvopt_options[12];
    double nstep;
    int err_code = 0;

    // count vars
    int nv = GetNumOfVars();
    if (nv < 1) {
        error_code = OPT_ERR_NOVARS;
        return false;
    }

    // nstep = fabs(initial_step);
    // if (minimize) nstep = nstep * (-1);

    nstep = -fabs(initial_step);  // nstep always negative,
                                  // always minimize otherwise solvopt() is buggy.

    error_code = OPT_ERR_OK;

    // set vector of options
    solvopt_options[0] = nstep;
    solvopt_options[1] = arg_tol;
    solvopt_options[2] = fun_tol;
    solvopt_options[3] = maxiters;
    solvopt_options[4] = 0;
    solvopt_options[5] = gamma;
    solvopt_options[6] = dilation;
    solvopt_options[7] = gradstep;
    solvopt_options[8] = 0;
    solvopt_options[9] = 0;
    solvopt_options[10] = 0;
    solvopt_options[11] = maxevaluations;

    int everyTotStep = 1;
    int breakCicle = 0;

    if (!C_vars) {
        // allocate variables vector
        if (xv)
            delete[] xv;
        xv = new double[nv + 3];  // or...[nv] :-)

        // populate vector with starting approximation
        // system->vector
        //	System_to_Vars(xv);
    }

    // call solver !!!!

    opt_fx = solvopt(nv,                   // numero di dimensioni
                     xv,                   // punto iniziale
                     CalcFO,               // funzione che calcola la funzione obiettivo di intersect
                     null_entry_solv_opt,  // nessuna gradiente
                     solvopt_options, (void*)this, showVarFun, everyTotStep, &breakCicle, err_code);

    // return auxiliary results and infos
    fx_evaluations = (long)solvopt_options[9];
    grad_evaluations = (long)solvopt_options[10];
    iters_done = (long)solvopt_options[8];

    // parse the error message
    /*
    switch (err_code)
    {
    case 0: sprintf (err_message, "OK: objective function optimized in %d steps", iters_done); break;
    case 2: strcpy  (err_message, "Error: insufficient memory for NR optimization"); break;
    case 3: strcpy  (err_message, "Error: objective function equals infinity"); break;
    case 4: strcpy  (err_message, "Error: zero gradient in local optimization"); break;
    case 7: strcpy  (err_message, "Warning: number of iterations exceeded the limit"); break;
    case 8: strcpy  (err_message, "Warning: user imposed stop"); break;
    }
    */

    // delete variables vector
    if (!C_vars) {
        // Vars_to_System(xv);
        if (xv)
            delete[] xv;
        xv = NULL;
    }

    return true;
}